

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT.cpp
# Opt level: O2

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
Storage::Disk::FAT::GetFile
          (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,shared_ptr<Storage::Disk::Disk> *disk,Volume *volume,File *file)

{
  int iVar1;
  pointer pvVar2;
  uchar *__first;
  uchar *__last;
  byte bVar3;
  bool bVar4;
  Sector *pSVar5;
  ushort uVar6;
  int c;
  uint uVar7;
  uint uVar8;
  CHS CVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  Parser parser;
  
  Encodings::MFM::Parser::Parser(&parser,Double,disk);
  contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = file->starting_cluster;
  bVar3 = volume->sectors_per_cluster;
  do {
    uVar8 = (uint)bVar3;
    iVar1 = volume->first_data_sector;
    for (uVar7 = 0; uVar7 < bVar3; uVar7 = uVar7 + 1) {
      CVar9 = Volume::chs_for_sector(volume,uVar7 + uVar8 * (uVar6 - 2) + iVar1);
      pSVar5 = Encodings::MFM::Parser::sector
                         (&parser,CVar9.head,CVar9.cylinder,(uint8_t)CVar9.sector);
      if ((pSVar5 == (Sector *)0x0) ||
         (pvVar2 = (pSVar5->samples).
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pvVar2 == (pSVar5->samples).
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_003e374a:
        bVar4 = false;
        goto LAB_003e374c;
      }
      __first = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      __last = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)__last - (long)__first != (ulong)volume->bytes_per_sector) goto LAB_003e374a;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (__first,__last,&contents);
      bVar3 = volume->sectors_per_cluster;
    }
    uVar6 = (volume->fat).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar6];
    if (0xfef < uVar6) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl = contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8) =
           contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10) =
           contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = true;
LAB_003e374c:
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_engaged = bVar4;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      Encodings::MFM::Parser::~Parser(&parser);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::optional<std::vector<uint8_t>> FAT::GetFile(const std::shared_ptr<Storage::Disk::Disk> &disk, const Volume &volume, const File &file) {
	Storage::Encodings::MFM::Parser parser(Storage::Encodings::MFM::Density::Double, disk);

	std::vector<uint8_t> contents;

	// In FAT cluster numbers describe a linked list via the FAT table, with values above $FF0 being reserved
	// (relevantly: FF7 means bad cluster; FF8–FFF mean end-of-file).
	uint16_t cluster = file.starting_cluster;
	do {
		const int sector = volume.sector_for_cluster(cluster);

		for(int c = 0; c < volume.sectors_per_cluster; c++) {
			const auto address = volume.chs_for_sector(sector + c);

			const Storage::Encodings::MFM::Sector *const sector_contents =
				parser.sector(address.head, address.cylinder, uint8_t(address.sector));
			if(!sector_contents || sector_contents->samples.empty() || sector_contents->samples[0].size() != volume.bytes_per_sector) {
				return std::nullopt;
			}
			std::copy(sector_contents->samples[0].begin(), sector_contents->samples[0].end(), std::back_inserter(contents));
		}

		cluster = volume.fat[cluster];
	} while(cluster < 0xff0);

	return contents;
}